

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::iterate(LongRunningShaderCase *this)

{
  undefined4 uVar1;
  undefined4 uVar3;
  code *pcVar2;
  int iVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  deUint32 dVar10;
  deUint32 dVar11;
  undefined4 uVar12;
  int iVar13;
  undefined4 extraout_var;
  RenderTarget *pRVar15;
  NotSupportedError *this_00;
  ulong uVar16;
  uint uVar17;
  size_type __n;
  ulong uVar18;
  Params *pPVar19;
  pointer piVar20;
  undefined1 auVar21 [16];
  float in_XMM3_Db;
  undefined1 auVar22 [16];
  float in_XMM4_Db;
  allocator<char> local_f9;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  vector<int,_std::allocator<int>_> iterCounts;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  string local_a8;
  undefined1 local_88 [8];
  IndexType local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78 [4];
  Random rnd;
  long lVar14;
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar14 = CONCAT44(extraout_var,iVar4);
  pPVar19 = this->m_params;
  dVar5 = deStringHash(pPVar19->name);
  dVar6 = deInt32Hash(pPVar19->shaderType);
  dVar7 = deInt32Hash(pPVar19->loopType);
  dVar8 = deInt32Hash(pPVar19->iterCountType);
  dVar9 = deInt32Hash(pPVar19->minLoopIterCount);
  dVar10 = deInt32Hash(pPVar19->maxLoopIterCount);
  dVar11 = deInt32Hash(pPVar19->numInvocations);
  deRandom_init(&rnd.m_rnd,dVar9 ^ dVar10 ^ dVar11 ^ dVar7 ^ dVar8 ^ dVar5 ^ dVar6);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            (&positions,(long)this->m_params->numInvocations,(allocator_type *)local_88);
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    __n = (size_type)this->m_params->numInvocations;
  }
  else {
    __n = 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&iterCounts,__n,(allocator_type *)local_88);
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vertexArrays.super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"a_position",&local_f9);
  glu::va::Float((VertexArrayBinding *)local_88,&local_a8,2,
                 (int)((ulong)((long)positions.
                                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)positions.
                                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3),0,
                 (positions.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_88);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a8);
  if (this->m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"a_iterCount",&local_f9);
    glu::va::Int32((VertexArrayBinding *)local_88,&local_a8,1,
                   (int)((ulong)((long)iterCounts.super__Vector_base<int,_std::allocator<int>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)iterCounts.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 2),0,
                   iterCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start);
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>(&vertexArrays,(VertexArrayBinding *)local_88);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  pRVar15 = Context::getRenderTarget((this->super_TestCase).m_context);
  uVar18 = (ulong)((long)positions.
                         super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)positions.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar1 = pRVar15->m_width;
  uVar3 = pRVar15->m_height;
  iVar4 = (int)uVar18;
  if ((int)(uVar3 * uVar1) < iVar4) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_88,"Too small viewport to fit all test points",
               (allocator<char> *)&local_a8);
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)local_88);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  auVar21._0_4_ = (float)(int)uVar1;
  auVar21._4_4_ = (float)(int)uVar3;
  auVar21._8_8_ = 0;
  uVar16 = 0;
  uVar18 = uVar18 & 0xffffffff;
  if (iVar4 < 1) {
    uVar18 = uVar16;
  }
  for (; uVar18 != uVar16; uVar16 = uVar16 + 1) {
    uVar17 = (int)uVar16 >> 0x1f;
    auVar22._0_4_ =
         (float)(int)((long)((ulong)uVar17 << 0x20 | uVar16 & 0xffffffff) % (long)(int)uVar1) + 0.5;
    auVar22._4_4_ =
         (float)(int)((long)((ulong)uVar17 << 0x20 | uVar16 & 0xffffffff) / (long)(int)uVar3) + 0.5;
    auVar22._8_4_ = in_XMM3_Db + 0.0;
    auVar22._12_4_ = in_XMM4_Db + 0.0;
    auVar22 = divps(auVar22,auVar21);
    in_XMM3_Db = auVar22._4_4_ + auVar22._4_4_ + -1.0;
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar16].m_data[0] =
         auVar22._0_4_ + auVar22._0_4_ + -1.0;
    positions.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar16].m_data[1] = in_XMM3_Db;
  }
  for (piVar20 = iterCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      piVar20 !=
      iterCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish; piVar20 = piVar20 + 1) {
    iVar4 = de::Random::getInt(&rnd,this->m_params->minLoopIterCount,
                               this->m_params->maxLoopIterCount);
    *piVar20 = iVar4;
  }
  (**(code **)(lVar14 + 0x1680))((this->m_program->m_program).m_program);
  pPVar19 = this->m_params;
  if (pPVar19->iterCountType == ITERCOUNTTYPE_UNIFORM) {
    pcVar2 = *(code **)(lVar14 + 0x14f0);
    uVar12 = (**(code **)(lVar14 + 0xb48))((this->m_program->m_program).m_program,"u_iterCount");
    (*pcVar2)(uVar12,*iterCounts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    pPVar19 = this->m_params;
  }
  local_88._4_4_ = pPVar19->numInvocations;
  local_88._0_4_ = 6;
  local_80 = INDEXTYPE_LAST;
  local_78[0]._M_allocated_capacity = (void *)0x0;
  glu::draw(((this->super_TestCase).m_context)->m_renderCtx,(this->m_program->m_program).m_program,
            (int)(((long)vertexArrays.
                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)vertexArrays.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x50),
            vertexArrays.
            super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
            _M_impl.super__Vector_impl_data._M_start,(PrimitiveList *)local_88,
            (DrawUtilCallback *)0x0);
  iVar13 = this->m_caseIterNdx + 1;
  this->m_caseIterNdx = iVar13;
  iVar4 = this->m_numCaseIters;
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            (&vertexArrays);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&iterCounts.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>);
  return (uint)(iVar13 < iVar4);
}

Assistant:

LongRunningShaderCase::IterateResult LongRunningShaderCase::iterate (void)
{
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	de::Random						rnd				(getSeed(*m_params));
	vector<Vec2>					positions		(m_params->numInvocations);
	vector<int>						iterCounts		(m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC ? m_params->numInvocations : 1);
	vector<glu::VertexArrayBinding>	vertexArrays;

	vertexArrays.push_back(glu::va::Float("a_position", 2, (int)positions.size(), 0, positions[0].getPtr()));
	if (m_params->iterCountType == ITERCOUNTTYPE_DYNAMIC)
		vertexArrays.push_back(glu::va::Int32("a_iterCount", 1, (int)iterCounts.size(), 0, &iterCounts[0]));

	genPositions(m_context.getRenderTarget(), (int)positions.size(), &positions[0]);

	for (vector<int>::iterator i = iterCounts.begin(); i != iterCounts.end(); ++i)
		*i = rnd.getInt(m_params->minLoopIterCount, m_params->maxLoopIterCount);

	gl.useProgram(m_program->getProgram());

	if (m_params->iterCountType == ITERCOUNTTYPE_UNIFORM)
		gl.uniform1i(gl.getUniformLocation(m_program->getProgram(), "u_iterCount"), iterCounts[0]);

	glu::draw(m_context.getRenderContext(), m_program->getProgram(),
			  (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(m_params->numInvocations));

	m_caseIterNdx += 1;
	return (m_caseIterNdx < m_numCaseIters) ? CONTINUE : STOP;
}